

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

char * __thiscall CInput::GetClipboardText(CInput *this)

{
  undefined8 uVar1;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x1250) != 0) {
    SDL_free(*(undefined8 *)(in_RDI + 0x1250));
  }
  uVar1 = SDL_GetClipboardText();
  *(undefined8 *)(in_RDI + 0x1250) = uVar1;
  if (*(long *)(in_RDI + 0x1250) != 0) {
    str_sanitize_cc(*(char **)(in_RDI + 0x1250));
  }
  return *(char **)(in_RDI + 0x1250);
}

Assistant:

const char *CInput::GetClipboardText()
{
	if(m_pClipboardText)
		SDL_free(m_pClipboardText);
	m_pClipboardText = SDL_GetClipboardText();
	if(m_pClipboardText)
		str_sanitize_cc(m_pClipboardText);
	return m_pClipboardText;
}